

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<int>::internalSetData<std::pair<int,int>>(Parameter<int> *this,pair<int,_int> data)

{
  bool bVar1;
  pair<int,_int> in_RSI;
  long in_RDI;
  bool result;
  int tmp;
  RepType local_14 [5];
  
  local_14[0] = 0;
  bVar1 = ParameterTraits<int>::convert<std::pair<int,int>>(in_RSI,local_14);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(RepType *)(in_RDI + 0x2c) = local_14[0];
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }